

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd.c
# Opt level: O0

void nsh_cmd_swap(nsh_cmd_t *cmd1,nsh_cmd_t *cmd2)

{
  undefined1 local_30 [8];
  nsh_cmd_t temp;
  nsh_cmd_t *cmd2_local;
  nsh_cmd_t *cmd1_local;
  
  temp.name._8_8_ = cmd2;
  nsh_cmd_copy((nsh_cmd_t *)local_30,cmd1);
  nsh_cmd_copy(cmd1,(nsh_cmd_t *)temp.name._8_8_);
  nsh_cmd_copy((nsh_cmd_t *)temp.name._8_8_,(nsh_cmd_t *)local_30);
  return;
}

Assistant:

void nsh_cmd_swap(nsh_cmd_t* cmd1, nsh_cmd_t* cmd2)
{
    nsh_cmd_t temp;
    nsh_cmd_copy(&temp, cmd1);
    nsh_cmd_copy(cmd1, cmd2);
    nsh_cmd_copy(cmd2, &temp);
}